

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendTo
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination)

{
  atomic<int> *paVar1;
  int iVar2;
  string_view string3;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *ppVar3;
  bool bVar4;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar5;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  InvalidParameter *this_02;
  char *pcVar6;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  __it;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  _Var7;
  long lVar8;
  long lVar9;
  string_view message_00;
  string_view message_01;
  string_view string2;
  size_t sStackY_160;
  size_t local_108;
  char *local_100;
  BrokerObject *local_f8;
  BrokerObject *pBStack_f0;
  ActionMessage message;
  
  if (destination._M_len == 0) {
    send(this,sourceHandle.hid,data,length,(int)destination._M_len);
    return;
  }
  puVar5 = getHandleInfo(this,sourceHandle);
  if (puVar5 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle is not valid";
    sStackY_160 = 0x13;
LAB_00298d82:
    message_00._M_str = pcVar6;
    message_00._M_len = sStackY_160;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (*(char *)((long)&puVar5[1]._M_t.
                       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                       .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4) !=
      'e') {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle does not point to an endpoint";
    sStackY_160 = 0x24;
    goto LAB_00298d82;
  }
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &puVar5[1]._M_t.
                                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl)
  ;
  if (((ulong)puVar5[1]._M_t.
              super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
              .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl & 0x400000000000000
      ) == 0) goto LAB_00298c65;
  FederateState::getMessageDestinations
            ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)&message,this_00,sourceHandle);
  __it._M_current =
       (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
       CONCAT44(message.messageID,message.messageAction);
  ppVar3 = (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
           CONCAT44(message.source_handle.hid,message.source_id.gid);
  lVar9 = (long)ppVar3 - (long)__it._M_current;
  local_108 = destination._M_len;
  local_100 = destination._M_str;
  for (lVar8 = lVar9 / 0x18 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it);
    _Var7._M_current = __it._M_current;
    if (bVar4) goto LAB_00298c50;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it._M_current + 1);
    _Var7._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_00298c50;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it._M_current + 2);
    _Var7._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_00298c50;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it._M_current + 3);
    _Var7._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_00298c50;
    __it._M_current = __it._M_current + 4;
    lVar9 = lVar9 + -0x60;
  }
  lVar9 = lVar9 / 0x18;
  if (lVar9 == 1) {
LAB_00298d3b:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it);
    _Var7._M_current = ppVar3;
    if (bVar4) {
      _Var7._M_current = __it._M_current;
    }
  }
  else if (lVar9 == 2) {
LAB_00298c24:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_108,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar4) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00298d3b;
    }
  }
  else {
    _Var7._M_current = ppVar3;
    if ((lVar9 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::$_0>
                ::operator()((_Iter_pred<helics::CommonCore::sendTo(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)::__0>
                              *)&local_108,__it), _Var7._M_current = __it._M_current, !bVar4)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00298c24;
    }
  }
LAB_00298c50:
  if (_Var7._M_current ==
      (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
      CONCAT44(message.source_handle.hid,message.source_id.gid)) {
    this_02 = (InvalidParameter *)__cxa_allocate_exception(0x28);
    message_01._M_str = "targeted endpoint destination not in target list";
    message_01._M_len = 0x30;
    InvalidParameter::InvalidParameter(this_02,message_01);
    __cxa_throw(this_02,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  std::
  _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)&message);
LAB_00298c65:
  ActionMessage::ActionMessage(&message,cmd_send_message);
  LOCK();
  paVar1 = &this->messageCounter;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  message.messageID = iVar2 + 1;
  message.source_id.gid =
       *(BaseType *)
        &(puVar5->_M_t).
         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
         _M_t.
         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>.
         super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  message.flags =
       *(uint16_t *)
        ((long)&puVar5[1]._M_t.
                super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
  message.source_handle.hid = sourceHandle.hid;
  SmallBuffer::assign(&message.payload,data,length);
  pBStack_f0 = puVar5[2]._M_t.
               super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
               .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  local_f8 = puVar5[3]._M_t.
             super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
             .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  string3._M_str = (char *)pBStack_f0;
  string3._M_len = (size_t)local_f8;
  string2._M_str = (char *)pBStack_f0;
  string2._M_len = (size_t)local_f8;
  ActionMessage::setStringData(&message,destination,string2,string3);
  message.actionTime.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&message);
  ActionMessage::~ActionMessage(&message);
  return;
}

Assistant:

void CommonCore::sendTo(InterfaceHandle sourceHandle,
                        const void* data,
                        uint64_t length,
                        std::string_view destination)
{
    if (destination.empty()) {
        // sendTo should be the equivalent of send if there is an empty destination
        send(sourceHandle, data, length);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }
    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.flags = hndl->flags;
    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);
    message.actionTime = fed->nextAllowedSendTime();
    addActionMessage(std::move(message));
}